

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_decode_test_small_Test::TestBody
          (rate_adaptive_code_from_colptr_rowIdx_decode_test_small_Test *this)

{
  _Bit_pointer *this_00;
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  pointer pdVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  char *in_R9;
  reference rVar6;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1b0 [7];
  bool success;
  vector<bool,_std::allocator<bool>_> solution;
  ulong local_178;
  size_t i;
  undefined1 local_168 [8];
  vector<double,_std::allocator<double>_> llrs;
  double vlog;
  double p;
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<bool,_std::allocator<bool>_> x_noised;
  vector<bool,_std::allocator<bool>_> syndrome;
  allocator<bool> local_c8;
  bool local_c7 [7];
  iterator local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  vector<bool,_std::allocator<bool>_> x;
  RateAdaptiveCode<unsigned_short> H;
  rate_adaptive_code_from_colptr_rowIdx_decode_test_small_Test *this_local;
  
  anon_unknown.dwarf_50475::get_code_small();
  local_c7[0] = true;
  local_c7[1] = true;
  local_c7[2] = true;
  local_c7[3] = true;
  local_c7[4] = false;
  local_c7[5] = false;
  local_c7[6] = false;
  local_c0 = local_c7;
  local_b8 = 7;
  std::allocator<bool>::allocator(&local_c8);
  __l_00._M_len = local_b8;
  __l_00._M_array = local_c0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_b0,__l_00,&local_c8);
  std::allocator<bool>::~allocator(&local_c8);
  this_00 = &x_noised.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)this_00);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::encode_no_ra<bool,bool>
            ((RateAdaptiveCode<unsigned_short> *)
             &x.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,(vector<bool,_std::allocator<bool>_> *)local_b0,
             (vector<bool,_std::allocator<bool>_> *)this_00);
  p._1_1_ = 1;
  p._2_1_ = 1;
  p._3_1_ = 1;
  p._4_1_ = 1;
  p._5_1_ = 0;
  p._6_1_ = 0;
  p._7_1_ = 1;
  local_138 = (iterator)((long)&p + 1);
  local_130 = 7;
  std::allocator<bool>::allocator((allocator<bool> *)&p);
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_128,__l,(allocator<bool> *)&p);
  std::allocator<bool>::~allocator((allocator<bool> *)&p);
  llrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)log(6.000000000000001);
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)local_b0);
  std::allocator<double>::allocator((allocator<double> *)((long)&i + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_168,sVar3,
             (allocator<double> *)((long)&i + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i + 7));
  for (local_178 = 0;
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_168),
      pdVar1 = llrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage, local_178 < sVar3;
      local_178 = local_178 + 1) {
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_128,local_178);
    solution.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = rVar6._M_p;
    bVar2 = std::_Bit_reference::operator_cast_to_bool
                      ((_Bit_reference *)
                       &solution.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_168,local_178);
    *pvVar4 = (double)pdVar1 * (double)(int)((uint)bVar2 * -2 + 1);
  }
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_1b0)
  ;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ =
       LDPC4QKD::RateAdaptiveCode<unsigned_short>::decode_at_current_rate<bool>
                 ((RateAdaptiveCode<unsigned_short> *)
                  &x.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_end_of_storage,(vector<double,_std::allocator<double>_> *)local_168,
                  (vector<bool,_std::allocator<bool>_> *)
                  &x_noised.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage,
                  (vector<bool,_std::allocator<bool>_> *)local_1b0,0x32,100.0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,
             (bool *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1c8,(AssertionResult *)"success",
               "false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  testing::internal::EqHelper::
  Compare<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_208,"solution","x",(vector<bool,_std::allocator<bool>_> *)local_1b0,
             (vector<bool,_std::allocator<bool>_> *)local_b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_1b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_168);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_128);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)
             &x_noised.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_b0)
  ;
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode
            ((RateAdaptiveCode<unsigned_short> *)
             &x.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, decode_test_small) {
    auto H = get_code_small();

    std::vector<Bit> x{1, 1, 1, 1, 0, 0, 0}; // true data to be sent
    std::vector<Bit> syndrome;
    H.encode_no_ra(x, syndrome);

    std::vector<Bit> x_noised{1, 1, 1, 1, 0, 0, 1}; // distorted data
    double p = 1. / 7; // channel error probability (we flipped 1 symbol out of 7)

    double vlog = log((1 - p) / p);
    std::vector<double> llrs(x.size());
    for (std::size_t i{}; i < llrs.size(); ++i) {
        llrs[i] = vlog * (1 - 2 * x_noised[i]); // log likelihood ratios
    }

    std::vector<Bit> solution;
    bool success = H.decode_at_current_rate(llrs, syndrome, solution);
    EXPECT_TRUE(success);
    EXPECT_EQ(solution, x);
}